

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_buffer.c
# Opt level: O3

int bufferResetArgs(mpt_iterator *it)

{
  int iVar1;
  
  it[2]._vptr = it[9]._vptr;
  it[10]._vptr = (_mpt_vptr_iterator *)0x0;
  it[0xb]._vptr = (_mpt_vptr_iterator *)0x0;
  iVar1 = bufferAdvance(it);
  if (0 < iVar1) {
    iVar1 = bufferAdvance(it);
    return iVar1;
  }
  return 0;
}

Assistant:

static int bufferResetArgs(MPT_INTERFACE(iterator) *it)
{
	MPT_STRUCT(metaBuffer) *m = MPT_baseaddr(metaBuffer, it, _it);
	int ret;
	if ((ret = bufferReset(&m->_it)) <= 0) {
		return ret;
	}
	/* consume first argument of iterator */
	return bufferAdvance(&m->_it);
}